

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vary_output_len.c
# Opt level: O0

int run_test(test_ctx context,test_vector vec,char *test_name)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  uint8_t *observed;
  uint8_t *buf;
  uint local_30;
  int local_2c;
  int out_len;
  int ret;
  uint8_t *in_buf;
  uint8_t *out_buf;
  char *test_name_local;
  
  local_2c = 0;
  observed = (uint8_t *)malloc(0x83);
  buf = (uint8_t *)calloc(vec.input_len,1);
  generate_input(buf,(int)vec.input_len);
  local_30 = 0;
  do {
    if (0x83 < (int)local_30) {
LAB_0010153d:
      if (local_2c == 0) {
        printf("%s passed!\n",test_name);
      }
      free(observed);
      free(buf);
      return local_2c;
    }
    memset(observed,0,0x83);
    iVar2 = EVP_DigestInit_ex((EVP_MD_CTX *)context.ctx,(EVP_MD *)context.md,(ENGINE *)0x0);
    if (iVar2 != 1) {
      ERR_print_errors_fp(_stderr);
      pFVar1 = _stderr;
      uVar3 = EVP_DigestInit_ex((EVP_MD_CTX *)context.ctx,(EVP_MD *)context.md,(ENGINE *)0x0);
      fprintf(pFVar1,"Failed %s:%i %s %i\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/J-Montgomery[P]blake3-prov/test/vary_output_len.c"
              ,0x4a,"EVP_DigestInit_ex(context.ctx, context.md, NULL)",(ulong)uVar3);
      return 1;
    }
    iVar2 = EVP_DigestUpdate((EVP_MD_CTX *)context.ctx,buf,vec.input_len);
    if (iVar2 != 1) {
      ERR_print_errors_fp(_stderr);
      pFVar1 = _stderr;
      uVar3 = EVP_DigestUpdate((EVP_MD_CTX *)context.ctx,buf,vec.input_len);
      fprintf(pFVar1,"Failed %s:%i %s %i\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/J-Montgomery[P]blake3-prov/test/vary_output_len.c"
              ,0x4b,"EVP_DigestUpdate(context.ctx, in_buf, vec.input_len)",(ulong)uVar3);
      return 1;
    }
    iVar2 = EVP_DigestFinalXOF(context.ctx,observed,(long)(int)local_30);
    if (iVar2 != 1) {
      ERR_print_errors_fp(_stderr);
      pFVar1 = _stderr;
      uVar3 = EVP_DigestFinalXOF(context.ctx,observed,(long)(int)local_30);
      fprintf(pFVar1,"Failed %s:%i %s %i\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/J-Montgomery[P]blake3-prov/test/vary_output_len.c"
              ,0x4c,"EVP_DigestFinalXOF(context.ctx, out_buf, out_len)",(ulong)uVar3);
      return 1;
    }
    local_2c = compare_buffers(observed,vec.hash,local_30);
    if (local_2c != 0) {
      fprintf(_stderr,"%s-%i Failed\n",test_name,(ulong)local_30);
      goto LAB_0010153d;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

int run_test(struct test_ctx context, struct test_vector vec, char *test_name)
{
	uint8_t *out_buf;
	uint8_t *in_buf;
	int ret = 0;

	out_buf = (uint8_t *)malloc(TEST_HASH_LEN);
	in_buf = (uint8_t *)calloc(vec.input_len, 1);
	generate_input(in_buf, vec.input_len);

	for (int out_len = 0; out_len <= TEST_HASH_LEN; out_len++) {
		memset(out_buf, 0, TEST_HASH_LEN);

		TEST_TRUE(EVP_DigestInit_ex(context.ctx, context.md, NULL));
		TEST_TRUE(EVP_DigestUpdate(context.ctx, in_buf, vec.input_len));
		TEST_TRUE(EVP_DigestFinalXOF(context.ctx, out_buf, out_len));

		ret = compare_buffers(out_buf, vec.hash, out_len);
		if(ret) {
			fprintf(stderr, "%s-%i Failed\n", test_name, out_len);
			break;
		}
	}


	if (!ret)
		printf("%s passed!\n", test_name);

	free(out_buf);
	free(in_buf);

	return ret;
}